

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_timecondition(SessionHandle *data,Curl_send_buffer *req_buffer)

{
  curl_TimeCond cVar1;
  CURLcode CVar2;
  char *buffer;
  int local_7c;
  undefined1 local_70 [8];
  tm keeptime;
  CURLcode result;
  char *buf;
  tm *tm;
  Curl_send_buffer *req_buffer_local;
  SessionHandle *data_local;
  
  buffer = (data->state).buffer;
  keeptime.tm_zone._4_4_ = 0;
  keeptime.tm_zone._4_4_ = Curl_gmtime((data->set).timevalue,(tm *)local_70);
  if (keeptime.tm_zone._4_4_ != CURLE_OK) {
    Curl_failf(data,"Invalid TIMEVALUE");
    return keeptime.tm_zone._4_4_;
  }
  if (keeptime.tm_mon == 0) {
    local_7c = 6;
  }
  else {
    local_7c = keeptime.tm_mon + -1;
  }
  curl_msnprintf(buffer,0x3fff,"%s, %02d %s %4d %02d:%02d:%02d GMT",Curl_wkday[local_7c],
                 (ulong)(uint)keeptime.tm_min,Curl_month[keeptime.tm_hour],keeptime.tm_mday + 0x76c,
                 keeptime.tm_sec,local_70._4_4_,local_70._0_4_);
  cVar1 = (data->set).timecondition;
  if (cVar1 != CURL_TIMECOND_IFMODSINCE) {
    if (cVar1 == CURL_TIMECOND_IFUNMODSINCE) {
      CVar2 = Curl_add_bufferf(req_buffer,"If-Unmodified-Since: %s\r\n",buffer);
      return CVar2;
    }
    if (cVar1 == CURL_TIMECOND_LASTMOD) {
      CVar2 = Curl_add_bufferf(req_buffer,"Last-Modified: %s\r\n",buffer);
      return CVar2;
    }
  }
  CVar2 = Curl_add_bufferf(req_buffer,"If-Modified-Since: %s\r\n",buffer);
  return CVar2;
}

Assistant:

CURLcode Curl_add_timecondition(struct SessionHandle *data,
                                Curl_send_buffer *req_buffer)
{
  const struct tm *tm;
  char *buf = data->state.buffer;
  CURLcode result = CURLE_OK;
  struct tm keeptime;

  result = Curl_gmtime(data->set.timevalue, &keeptime);
  if(result) {
    failf(data, "Invalid TIMEVALUE");
    return result;
  }
  tm = &keeptime;

  /* The If-Modified-Since header family should have their times set in
   * GMT as RFC2616 defines: "All HTTP date/time stamps MUST be
   * represented in Greenwich Mean Time (GMT), without exception. For the
   * purposes of HTTP, GMT is exactly equal to UTC (Coordinated Universal
   * Time)." (see page 20 of RFC2616).
   */

  /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
  snprintf(buf, BUFSIZE-1,
           "%s, %02d %s %4d %02d:%02d:%02d GMT",
           Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
           tm->tm_mday,
           Curl_month[tm->tm_mon],
           tm->tm_year + 1900,
           tm->tm_hour,
           tm->tm_min,
           tm->tm_sec);

  switch(data->set.timecondition) {
  case CURL_TIMECOND_IFMODSINCE:
  default:
    result = Curl_add_bufferf(req_buffer,
                              "If-Modified-Since: %s\r\n", buf);
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    result = Curl_add_bufferf(req_buffer,
                              "If-Unmodified-Since: %s\r\n", buf);
    break;
  case CURL_TIMECOND_LASTMOD:
    result = Curl_add_bufferf(req_buffer,
                              "Last-Modified: %s\r\n", buf);
    break;
  }

  return result;
}